

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
deqp::gles3::Performance::anon_unknown_0::Utils::getFullscreenQuad
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,float depth)

{
  vector<float,_std::allocator<float>_> *extraout_RAX;
  allocator_type local_69;
  float local_68 [3];
  undefined8 local_5c;
  undefined4 local_54;
  float local_50;
  undefined8 local_4c;
  undefined4 local_44;
  float local_40;
  undefined8 local_3c;
  undefined4 local_34;
  float local_30;
  undefined8 local_2c;
  undefined4 local_24;
  float local_20;
  undefined8 local_1c;
  undefined4 local_14;
  float local_10;
  undefined4 local_c;
  float local_8 [2];
  
  local_68[0] = 1.0;
  local_68[1] = 1.0;
  local_5c = 0x3f80000000000000;
  local_54 = 0xbf800000;
  local_4c = 0xbf8000003f800000;
  local_44 = 0xbf800000;
  local_3c = 0xbf80000040000000;
  local_34 = 0xbf800000;
  local_2c = 0xbf80000000000000;
  local_24 = 0x3f800000;
  local_1c = 0x3f8000003f800000;
  local_14 = 0x3f800000;
  local_c = 0x40000000;
  local_68[2] = depth;
  local_50 = depth;
  local_40 = depth;
  local_30 = depth;
  local_20 = depth;
  local_10 = depth;
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)__return_storage_ptr__,local_68,local_8,
             &local_69);
  return extraout_RAX;
}

Assistant:

vector<float> getFullscreenQuad (float depth)
	{
		const float data[] =
		{
			+1.0f, +1.0f, depth, 0.0f, // .w is gl_VertexId%3 since Nexus 4&5 can't handle that on their own
			+1.0f, -1.0f, depth, 1.0f,
			-1.0f, -1.0f, depth, 2.0f,
			-1.0f, -1.0f, depth, 0.0f,
			-1.0f, +1.0f, depth, 1.0f,
			+1.0f, +1.0f, depth, 2.0f,
		};

		return vector<float>(DE_ARRAY_BEGIN(data), DE_ARRAY_END(data));
	}